

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

void md_analyze_tilde(MD_CTX *ctx,int mark_index)

{
  int opener_index_00;
  MD_MARKSTACK *stack_00;
  int in_ESI;
  MD_CTX *in_RDI;
  int opener_index;
  MD_MARKSTACK *stack;
  MD_MARK *mark;
  MD_MARK *pMVar1;
  undefined4 in_stack_fffffffffffffff0;
  
  pMVar1 = in_RDI->marks + in_ESI;
  stack_00 = md_opener_stack(in_RDI,in_ESI);
  if (((pMVar1->flags & 2) == 0) || (stack_00->top < 0)) {
    if ((pMVar1->flags & 1) != 0) {
      md_mark_stack_push(in_RDI,stack_00,in_ESI);
    }
  }
  else {
    opener_index_00 = stack_00->top;
    md_mark_stack_pop(in_RDI,stack_00);
    md_rollback((MD_CTX *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)((ulong)pMVar1 >> 0x20),
                (int)pMVar1,(int)((ulong)stack_00 >> 0x20));
    md_resolve_range(in_RDI,opener_index_00,in_ESI);
  }
  return;
}

Assistant:

static void
md_analyze_tilde(MD_CTX* ctx, int mark_index)
{
    MD_MARK* mark = &ctx->marks[mark_index];
    MD_MARKSTACK* stack = md_opener_stack(ctx, mark_index);

    /* We attempt to be Github Flavored Markdown compatible here. GFM accepts
     * only tildes sequences of length 1 and 2, and the length of the opener
     * and closer has to match. */

    if((mark->flags & MD_MARK_POTENTIAL_CLOSER)  &&  stack->top >= 0) {
        int opener_index = stack->top;

        md_mark_stack_pop(ctx, stack);
        md_rollback(ctx, opener_index, mark_index, MD_ROLLBACK_CROSSING);
        md_resolve_range(ctx, opener_index, mark_index);
        return;
    }

    if(mark->flags & MD_MARK_POTENTIAL_OPENER)
        md_mark_stack_push(ctx, stack, mark_index);
}